

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall problem_parser::set_bound_variable(problem_parser *this,bound_token bound)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  uVar5 = get_variable(this,bound.name);
  if (-1 < (int)uVar5) {
    uVar4 = vcmppd_avx512vl((undefined1  [16])bound._0_16_,_DAT_0054b850,0);
    auVar6 = vmovdqa32_avx512vl(_DAT_0054b860);
    bVar2 = (bool)((byte)(uVar4 & 3) & 1);
    bVar3 = SUB81((uVar4 & 3) >> 1,0);
    pvVar1 = (this->m_problem).vars.values.
             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar5;
    pvVar1->min = (uint)bVar2 * auVar6._0_4_ | (uint)!bVar2 * (int)bound.min;
    pvVar1->max = (uint)bVar3 * auVar6._4_4_ | (uint)!bVar3 * (int)bound.max;
  }
  return -1 < (int)uVar5;
}

Assistant:

[[nodiscard]] bool set_bound_variable(bound_token bound)
    {
        auto id = get_variable(bound.name);
        if (id < 0)
            return false;

        // We only use a binary/integer solver.
        // m_problem.vars.values[id].min = bound.min;
        // m_problem.vars.values[id].max = bound.max;

        m_problem.vars.values[id].min =
          (bound.min == -std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::min()
             : static_cast<int>(bound.min));

        m_problem.vars.values[id].max =
          (bound.max == std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::max()
             : static_cast<int>(bound.max));

        return true;
    }